

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::bindRenderbuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  int *piVar1;
  Renderbuffer *this_00;
  
  if (target == 0x8d41) {
    if (name == 0) {
      this_00 = (Renderbuffer *)0x0;
    }
    else {
      this_00 = rc::ObjectManager<sglr::rc::Renderbuffer>::find(&this->m_renderbuffers,name);
      if (this_00 == (Renderbuffer *)0x0) {
        this_00 = (Renderbuffer *)operator_new(0x38);
        rc::Renderbuffer::Renderbuffer(this_00,name);
        rc::ObjectManager<sglr::rc::Renderbuffer>::insert(&this->m_renderbuffers,this_00);
      }
    }
    if (this->m_renderbufferBinding != (Renderbuffer *)0x0) {
      rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference
                (&this->m_renderbuffers,this->m_renderbufferBinding);
    }
    if (this_00 != (Renderbuffer *)0x0) {
      piVar1 = &(this_00->super_NamedObject).m_refCount;
      *piVar1 = *piVar1 + 1;
    }
    this->m_renderbufferBinding = this_00;
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bindRenderbuffer (deUint32 target, deUint32 name)
{
	Renderbuffer* rbo = DE_NULL;

	RC_IF_ERROR(target != GL_RENDERBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		rbo = m_renderbuffers.find(name);
		if (!rbo)
		{
			rbo = new Renderbuffer(name);
			m_renderbuffers.insert(rbo);
		}
	}

	// Remove old reference
	if (m_renderbufferBinding)
		m_renderbuffers.releaseReference(m_renderbufferBinding);

	// Create new reference
	if (rbo)
		m_renderbuffers.acquireReference(rbo);

	m_renderbufferBinding = rbo;
}